

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

StringRep * __thiscall
google::protobuf::internal::MicroString::AllocateStringRep(MicroString *this,Arena *arena)

{
  LargeRepKind t;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_40;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  StringRep *h;
  Arena *arena_local;
  MicroString *this_local;
  
  h = (StringRep *)arena;
  arena_local = (Arena *)this;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       Arena::Create<google::protobuf::internal::MicroString::StringRep>(arena);
  (((StringRep *)absl_log_internal_check_op_result)->super_LargeRep).capacity = 2;
  this->rep_ = (void *)((ulong)absl_log_internal_check_op_result | 1);
  t = large_rep_kind(this);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(2);
  local_28 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"+large_rep_kind() == +kString");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
               ,0x9a,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return (StringRep *)absl_log_internal_check_op_result;
}

Assistant:

MicroString::StringRep* MicroString::AllocateStringRep(Arena* arena) {
  StringRep* h = Arena::Create<StringRep>(arena);
  h->capacity = kString;
  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kString);
  return h;
}